

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PodVectorTests.cpp
# Opt level: O0

void __thiscall agge::tests::PODVectorTests::NewVectorHasExpectedState(PODVectorTests *this)

{
  bool bVar1;
  count_t cVar2;
  iterator pAVar3;
  iterator pAVar4;
  const_iterator pBVar5;
  const_iterator pBVar6;
  allocator local_5d9;
  string local_5d8 [32];
  LocationInfo local_5b8;
  long local_590;
  int local_588;
  allocator local_581;
  string local_580 [32];
  LocationInfo local_560;
  allocator local_531;
  string local_530 [32];
  LocationInfo local_510;
  count_t local_4e4;
  uint local_4e0;
  allocator local_4d9;
  string local_4d8 [32];
  LocationInfo local_4b8;
  allocator local_489;
  string local_488 [32];
  LocationInfo local_468;
  long local_440;
  int local_438;
  allocator local_431;
  string local_430 [32];
  LocationInfo local_410;
  allocator local_3e1;
  string local_3e0 [32];
  LocationInfo local_3c0;
  count_t local_394;
  uint local_390;
  allocator local_389;
  string local_388 [32];
  LocationInfo local_368;
  allocator local_339;
  string local_338 [32];
  LocationInfo local_318;
  iterator local_2f0;
  iterator local_2e8;
  allocator local_2d9;
  string local_2d8 [32];
  LocationInfo local_2b8;
  count_t local_28c;
  uint local_288;
  allocator local_281;
  string local_280 [32];
  LocationInfo local_260;
  count_t local_234;
  uint local_230;
  allocator local_229;
  string local_228 [32];
  LocationInfo local_208;
  allocator local_1d9;
  string local_1d8 [32];
  LocationInfo local_1b8;
  iterator local_190;
  iterator local_188;
  allocator local_179;
  string local_178 [32];
  LocationInfo local_158;
  count_t local_12c;
  uint local_128;
  allocator local_121;
  string local_120 [32];
  LocationInfo local_100;
  count_t local_d4;
  uint local_d0;
  allocator local_c9;
  string local_c8 [32];
  LocationInfo local_a8;
  undefined1 local_80 [8];
  pod_vector<agge::tests::(anonymous_namespace)::B> Bs;
  pod_vector<agge::tests::(anonymous_namespace)::A> As;
  undefined1 local_40 [8];
  pod_vector<double> empty2;
  pod_vector<char> empty1;
  PODVectorTests *this_local;
  
  pod_vector<char>::pod_vector((pod_vector<char> *)&empty2._limit,0);
  pod_vector<double>::pod_vector((pod_vector<double> *)local_40,0);
  pod_vector<agge::tests::(anonymous_namespace)::A>::pod_vector
            ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit,10);
  pod_vector<agge::tests::(anonymous_namespace)::B>::pod_vector
            ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80,0x339b);
  bVar1 = pod_vector<char>::empty((pod_vector<char> *)&empty2._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_c9);
  ut::LocationInfo::LocationInfo(&local_a8,(string *)local_c8,0x2b);
  ut::is_true(bVar1,&local_a8);
  ut::LocationInfo::~LocationInfo(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_d0 = 0;
  local_d4 = pod_vector<char>::size((pod_vector<char> *)&empty2._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_121);
  ut::LocationInfo::LocationInfo(&local_100,(string *)local_120,0x2c);
  ut::are_equal<unsigned_int,unsigned_int>(&local_d0,&local_d4,&local_100);
  ut::LocationInfo::~LocationInfo(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_128 = 0;
  local_12c = pod_vector<char>::capacity((pod_vector<char> *)&empty2._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_179);
  ut::LocationInfo::LocationInfo(&local_158,(string *)local_178,0x2d);
  ut::are_equal<unsigned_int,unsigned_int>(&local_128,&local_12c,&local_158);
  ut::LocationInfo::~LocationInfo(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  local_188 = pod_vector<char>::end((pod_vector<char> *)&empty2._limit);
  local_190 = pod_vector<char>::begin((pod_vector<char> *)&empty2._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_1d9);
  ut::LocationInfo::LocationInfo(&local_1b8,(string *)local_1d8,0x2e);
  ut::are_equal<char*,char*>(&local_188,&local_190,&local_1b8);
  ut::LocationInfo::~LocationInfo(&local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  bVar1 = pod_vector<double>::empty((pod_vector<double> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_229);
  ut::LocationInfo::LocationInfo(&local_208,(string *)local_228,0x2f);
  ut::is_true(bVar1,&local_208);
  ut::LocationInfo::~LocationInfo(&local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_230 = 0;
  local_234 = pod_vector<double>::size((pod_vector<double> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_281);
  ut::LocationInfo::LocationInfo(&local_260,(string *)local_280,0x30);
  ut::are_equal<unsigned_int,unsigned_int>(&local_230,&local_234,&local_260);
  ut::LocationInfo::~LocationInfo(&local_260);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  local_288 = 0;
  local_28c = pod_vector<double>::capacity((pod_vector<double> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_2d9);
  ut::LocationInfo::LocationInfo(&local_2b8,(string *)local_2d8,0x31);
  ut::are_equal<unsigned_int,unsigned_int>(&local_288,&local_28c,&local_2b8);
  ut::LocationInfo::~LocationInfo(&local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  local_2e8 = pod_vector<double>::end((pod_vector<double> *)local_40);
  local_2f0 = pod_vector<double>::begin((pod_vector<double> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_338,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_339);
  ut::LocationInfo::LocationInfo(&local_318,(string *)local_338,0x32);
  ut::are_equal<double*,double*>(&local_2e8,&local_2f0,&local_318);
  ut::LocationInfo::~LocationInfo(&local_318);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  bVar1 = pod_vector<agge::tests::(anonymous_namespace)::A>::empty
                    ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_388,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_389);
  ut::LocationInfo::LocationInfo(&local_368,(string *)local_388,0x34);
  ut::is_false(bVar1,&local_368);
  ut::LocationInfo::~LocationInfo(&local_368);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  local_390 = 10;
  local_394 = pod_vector<agge::tests::(anonymous_namespace)::A>::size
                        ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_3e1);
  ut::LocationInfo::LocationInfo(&local_3c0,(string *)local_3e0,0x35);
  ut::are_equal<unsigned_int,unsigned_int>(&local_390,&local_394,&local_3c0);
  ut::LocationInfo::~LocationInfo(&local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  cVar2 = pod_vector<agge::tests::(anonymous_namespace)::A>::capacity
                    ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_430,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_431);
  ut::LocationInfo::LocationInfo(&local_410,(string *)local_430,0x36);
  ut::is_true(9 < cVar2,&local_410);
  ut::LocationInfo::~LocationInfo(&local_410);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  local_438 = 10;
  pAVar3 = pod_vector<agge::tests::(anonymous_namespace)::A>::end
                     ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit);
  pAVar4 = pod_vector<agge::tests::(anonymous_namespace)::A>::begin
                     ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit);
  local_440 = (long)pAVar3 - (long)pAVar4 >> 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_488,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_489);
  ut::LocationInfo::LocationInfo(&local_468,(string *)local_488,0x37);
  ut::are_equal<int,long>(&local_438,&local_440,&local_468);
  ut::LocationInfo::~LocationInfo(&local_468);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  bVar1 = pod_vector<agge::tests::(anonymous_namespace)::B>::empty
                    ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_4d9);
  ut::LocationInfo::LocationInfo(&local_4b8,(string *)local_4d8,0x38);
  ut::is_false(bVar1,&local_4b8);
  ut::LocationInfo::~LocationInfo(&local_4b8);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  local_4e0 = 0x339b;
  local_4e4 = pod_vector<agge::tests::(anonymous_namespace)::B>::size
                        ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_530,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_531);
  ut::LocationInfo::LocationInfo(&local_510,(string *)local_530,0x39);
  ut::are_equal<unsigned_int,unsigned_int>(&local_4e0,&local_4e4,&local_510);
  ut::LocationInfo::~LocationInfo(&local_510);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  cVar2 = pod_vector<agge::tests::(anonymous_namespace)::B>::capacity
                    ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_580,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_581);
  ut::LocationInfo::LocationInfo(&local_560,(string *)local_580,0x3a);
  ut::is_true(0x339a < cVar2,&local_560);
  ut::LocationInfo::~LocationInfo(&local_560);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  local_588 = 0x339b;
  pBVar5 = pod_vector<agge::tests::(anonymous_namespace)::B>::end
                     ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80);
  pBVar6 = pod_vector<agge::tests::(anonymous_namespace)::B>::begin
                     ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80);
  local_590 = (long)pBVar5 - (long)pBVar6 >> 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PodVectorTests.cpp"
             ,&local_5d9);
  ut::LocationInfo::LocationInfo(&local_5b8,(string *)local_5d8,0x3b);
  ut::are_equal<int,long>(&local_588,&local_590,&local_5b8);
  ut::LocationInfo::~LocationInfo(&local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  pod_vector<agge::tests::(anonymous_namespace)::B>::~pod_vector
            ((pod_vector<agge::tests::(anonymous_namespace)::B> *)local_80);
  pod_vector<agge::tests::(anonymous_namespace)::A>::~pod_vector
            ((pod_vector<agge::tests::(anonymous_namespace)::A> *)&Bs._limit);
  pod_vector<double>::~pod_vector((pod_vector<double> *)local_40);
  pod_vector<char>::~pod_vector((pod_vector<char> *)&empty2._limit);
  return;
}

Assistant:

test( NewVectorHasExpectedState )
			{
				// INIT / ACT
				pod_vector<char> empty1;
				pod_vector<double> empty2(0);
				pod_vector<A> As(10);
				const pod_vector<B> Bs(13211);

				// ACT / ASSERT
				assert_is_true(empty1.empty());
				assert_equal(0u, empty1.size());
				assert_equal(0u, empty1.capacity());
				assert_equal(empty1.end(), empty1.begin());
				assert_is_true(empty2.empty());
				assert_equal(0u, empty2.size());
				assert_equal(0u, empty2.capacity());
				assert_equal(empty2.end(), empty2.begin());

				assert_is_false(As.empty());
				assert_equal(10u, As.size());
				assert_is_true(10u <= As.capacity());
				assert_equal(10, As.end() - As.begin());
				assert_is_false(Bs.empty());
				assert_equal(13211u, Bs.size());
				assert_is_true(13211u <= Bs.capacity());
				assert_equal(13211, Bs.end() - Bs.begin());
			}